

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O2

Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readSequence_abi_cxx11_
          (Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  YamlEvent *pYVar1;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *__args;
  Mapping *__args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *this_00;
  undefined1 uVar3;
  Sequence seq;
  YamlEvent event;
  Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  vector<yaml::Value,_std::allocator<yaml::Value>_> local_f8;
  undefined1 local_e0 [8];
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  anon_union_48_2_9b3c4038_for_Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_b8;
  char local_88;
  string local_80;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  local_f8.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_0013affb:
  getNextEvent_abi_cxx11_(&local_60,this);
  if (local_60.has_value_ == false) {
    pbVar2 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error(&local_60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   "Error while reading sequence: ",pbVar2);
    local_b8.error_.error_._M_dataplus._M_p =
         (_Alloc_hider)
         ((long)&local_b8.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    if (local_e0 == (undefined1  [8])(local_d8 + 8)) {
      local_b8.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)aStack_c8._M_allocated_capacity;
    }
    else {
      local_b8.error_.error_._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_e0;
    }
    this_00 = (string *)local_e0;
    local_b8.error_.error_._M_string_length = local_d8._0_8_;
    local_d8._0_8_ = (pointer)0x0;
    local_d8[8] = '\0';
    local_e0 = (undefined1  [8])(local_d8 + 8);
    Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_b8.value_);
    std::__cxx11::string::~string((string *)&local_b8.value_);
LAB_0013b272:
    std::__cxx11::string::~string(this_00);
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected(&local_60);
    std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&local_f8);
    return __return_storage_ptr__;
  }
  pYVar1 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value(&local_60);
  YamlEvent::YamlEvent((YamlEvent *)local_e0,pYVar1);
  switch(local_e0._0_4_) {
  case 6:
    std::vector<yaml::Value,std::allocator<yaml::Value>>::emplace_back<std::__cxx11::string>
              ((vector<yaml::Value,std::allocator<yaml::Value>> *)&local_f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    goto LAB_0013b123;
  case 7:
    readSequence_abi_cxx11_
              ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_b8.value_,this);
    uVar3 = local_b8._32_1_;
    if (local_b8._32_1_ == '\0') {
      pbVar2 = Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8.value_);
      std::__cxx11::string::string((string *)&local_80,(string *)pbVar2);
      Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    else {
      __args = Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8.value_);
      std::vector<yaml::Value,std::allocator<yaml::Value>>::
      emplace_back<std::vector<yaml::Value,std::allocator<yaml::Value>>>
                ((vector<yaml::Value,std::allocator<yaml::Value>> *)&local_f8,__args);
    }
    Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8.value_);
    goto LAB_0013b117;
  case 8:
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_start = local_f8.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_f8.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_f8.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_f8.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->has_value_ = true;
    break;
  case 9:
    readMapping_abi_cxx11_
              ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_b8.value_,this);
    uVar3 = local_88;
    if (local_88 == '\0') {
      pbVar2 = Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8.value_);
      std::__cxx11::string::string((string *)&local_80,(string *)pbVar2);
      Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    else {
      __args_00 = Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_b8.value_);
      std::vector<yaml::Value,_std::allocator<yaml::Value>_>::emplace_back<yaml::Mapping>
                (&local_f8,__args_00);
    }
    Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8.value_);
LAB_0013b117:
    if (uVar3 == '\0') break;
LAB_0013b123:
    std::__cxx11::string::~string((string *)local_d8);
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected(&local_60);
    goto LAB_0013affb;
  default:
    format_abi_cxx11_(&local_80,"Unexpected event %d");
    local_b8.error_.error_._M_dataplus._M_p =
         (_Alloc_hider)
         ((long)&local_b8.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      local_b8.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)local_80.field_2._8_8_;
    }
    else {
      local_b8.error_.error_._M_dataplus._M_p =
           (_Alloc_hider)(_Alloc_hider)local_80._M_dataplus._M_p;
    }
    local_b8.error_.error_._M_string_length = local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_b8.value_);
    std::__cxx11::string::~string((string *)&local_b8.value_);
    std::__cxx11::string::~string((string *)&local_80);
  }
  this_00 = (string *)local_d8;
  goto LAB_0013b272;
}

Assistant:

Expected<Sequence, std::string> readSequence() {
		Sequence seq;
		for (;;) {
			auto event_result = getNextEvent();
			if (!event_result)
				return Unexpected("Error while reading sequence: " + event_result.error());
			YamlEvent event = std::move(event_result).value();

			switch (event.type) {
				case YAML_SCALAR_EVENT:
					MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
					seq.emplace_back(std::move(event.value));
					break;
				case YAML_SEQUENCE_START_EVENT:
					MSG("YAML_SEQUENCE_START_EVENT");
					{
						auto result = readSequence();
						if (!result)
							return Unexpected(result.error());
						seq.emplace_back(std::move(result).value());
					}
					break;
				case YAML_MAPPING_START_EVENT:
					MSG("YAML_MAPPING_START_EVENT");
					{
						auto result = readMapping();
						if (!result)
							return Unexpected(result.error());
						seq.emplace_back(std::move(result).value());
					}
					break;
				case YAML_SEQUENCE_END_EVENT:
					MSG("YAML_SEQUENCE_END_EVENT");
					return seq;
				default:
					return Unexpected(format("Unexpected event %d", event.type));
			}
		}
	}